

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerWrapClampToBorderCase::test
          (SamplerWrapClampToBorderCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  allocator<char> local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  GLenum local_28;
  
  glu::CallLogWrapper::glSamplerParameteri
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x812d);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Got Error ",&local_d1);
    local_30 = glu::getErrorName;
    local_28 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d0,&local_30);
    std::operator+(&local_90,&local_b0,&local_d0);
    std::operator+(&local_70,&local_90,": ");
    std::operator+(&local_50,&local_70,"glSamplerParameteri");
    tcu::ResultCollector::fail(result,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x812d,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameteri
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x2901);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Got Error ",&local_d1);
    local_30 = glu::getErrorName;
    local_28 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d0,&local_30);
    std::operator+(&local_90,&local_b0,&local_d0);
    std::operator+(&local_70,&local_90,": ");
    std::operator+(&local_50,&local_70,"glSamplerParameteri");
    tcu::ResultCollector::fail(result,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  glu::CallLogWrapper::glSamplerParameterf
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,33069.0);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Got Error ",&local_d1);
    local_30 = glu::getErrorName;
    local_28 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d0,&local_30);
    std::operator+(&local_90,&local_b0,&local_d0);
    std::operator+(&local_70,&local_90,": ");
    std::operator+(&local_50,&local_70,"glSamplerParameterf");
    tcu::ResultCollector::fail(result,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x812d,
             (this->super_SamplerTest).m_type);
  return;
}

Assistant:

void SamplerWrapClampToBorderCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	gl.glSamplerParameteri(m_target, m_pname, GL_CLAMP_TO_BORDER_EXT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");
	verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_CLAMP_TO_BORDER_EXT, m_type);

	gl.glSamplerParameteri(m_target, m_pname, GL_REPEAT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

	gl.glSamplerParameterf(m_target, m_pname, (GLfloat)GL_CLAMP_TO_BORDER_EXT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

	verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_CLAMP_TO_BORDER_EXT, m_type);
}